

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,uint32_t varTop,UErrorCode *errorCode)

{
  uint uVar1;
  int32_t script;
  CollationSettings *this_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (this->settings->variableTop != varTop) {
    script = CollationData::getGroupForPrimary(this->data,varTop);
    if (script - 0x1004U < 0xfffffffc) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    varTop = CollationData::getLastPrimaryForGroup(this->data,script);
    if (varTop != this->settings->variableTop) {
      this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
      if (this_00 == (CollationSettings *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      CollationSettings::setMaxVariable
                (this_00,script + -0x1000,this->tailoring->settings->options,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      this_00->variableTop = varTop;
      setFastLatinOptions(this,this_00);
    }
  }
  if (varTop == this->tailoring->settings->variableTop) {
    uVar1 = this->explicitlySetAttributes & 0xfffffeff;
  }
  else {
    uVar1 = this->explicitlySetAttributes | 0x100;
  }
  this->explicitlySetAttributes = uVar1;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }